

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O2

int ecp_mod_p256(mbedtls_mpi *N)

{
  ulong uVar1;
  ulong *puVar2;
  mbedtls_mpi_uint *pmVar3;
  ushort uVar4;
  mbedtls_mpi_uint *pmVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  byte bVar15;
  uint uVar16;
  char cVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  
  iVar7 = mbedtls_mpi_grow(N,9);
  if (iVar7 == 0) {
    pmVar5 = N->p;
    uVar9 = pmVar5[4];
    uVar6 = (uint)uVar9;
    uVar18 = (uint)*pmVar5;
    uVar26 = uVar6 + uVar18;
    uVar16 = (uint)(uVar9 >> 0x20);
    uVar27 = uVar26 + uVar16;
    uVar11 = (uint)(pmVar5[5] >> 0x20);
    uVar28 = uVar27 - uVar11;
    uVar13 = (uint)pmVar5[6];
    uVar29 = uVar28 - uVar13;
    uVar14 = (uint)(pmVar5[6] >> 0x20);
    uVar30 = uVar29 - uVar14;
    uVar24 = (uint)pmVar5[7];
    cVar17 = ((((CARRY4(uVar26,uVar16) + CARRY4(uVar6,uVar18)) - (uVar27 < uVar11)) -
              (uVar28 < uVar13)) - (uVar29 < uVar14)) - (uVar30 < uVar24);
    uVar18 = (uint)cVar17;
    uVar26 = (uint)(*pmVar5 >> 0x20);
    if (cVar17 < '\0') {
      cVar17 = -(uVar26 < -uVar18);
    }
    else {
      cVar17 = CARRY4(uVar18,uVar26);
    }
    uVar28 = uVar18 + uVar26 + uVar16;
    uVar27 = (uint)pmVar5[5];
    uVar29 = uVar28 + uVar27;
    uVar19 = uVar29 - uVar13;
    uVar20 = uVar19 - uVar14;
    uVar21 = uVar20 - uVar24;
    uVar25 = (uint)(pmVar5[7] >> 0x20);
    cVar17 = ((((CARRY4(uVar18 + uVar26,uVar16) + cVar17 + CARRY4(uVar28,uVar27)) -
               (uVar29 < uVar13)) - (uVar19 < uVar14)) - (uVar20 < uVar24)) - (uVar21 < uVar25);
    *pmVar5 = CONCAT44(uVar21 - uVar25,uVar30 - uVar24);
    uVar26 = (uint)cVar17;
    uVar18 = (uint)pmVar5[1];
    if (cVar17 < '\0') {
      cVar17 = -(uVar18 < -uVar26);
    }
    else {
      cVar17 = CARRY4(uVar26,uVar18);
    }
    uVar28 = uVar26 + uVar18 + uVar27;
    uVar29 = uVar28 + uVar11;
    uVar30 = uVar29 - uVar14;
    uVar19 = uVar30 - uVar24;
    cVar17 = (((CARRY4(uVar26 + uVar18,uVar27) + cVar17 + CARRY4(uVar28,uVar11)) - (uVar29 < uVar14)
              ) - (uVar30 < uVar24)) - (uVar19 < uVar25);
    uVar26 = (uint)cVar17;
    uVar18 = (uint)(pmVar5[1] >> 0x20);
    if (cVar17 < '\0') {
      cVar17 = -(uVar18 < -uVar26);
    }
    else {
      cVar17 = CARRY4(uVar26,uVar18);
    }
    uVar28 = uVar26 + uVar18 + uVar11;
    uVar29 = uVar28 + uVar11;
    uVar30 = uVar29 + uVar13;
    uVar20 = uVar30 + uVar13;
    uVar21 = uVar20 + uVar14;
    uVar22 = uVar21 - uVar25;
    uVar23 = uVar22 - uVar6;
    cVar17 = (((CARRY4(uVar30,uVar13) +
                CARRY4(uVar28,uVar11) + cVar17 + CARRY4(uVar26 + uVar18,uVar11) +
                CARRY4(uVar29,uVar13) + CARRY4(uVar20,uVar14)) - (uVar21 < uVar25)) -
             (uVar22 < uVar6)) - (uVar23 < uVar16);
    pmVar5[1] = CONCAT44(uVar23 - uVar16,uVar19 - uVar25);
    uVar26 = (uint)cVar17;
    uVar18 = (uint)pmVar5[2];
    if (cVar17 < '\0') {
      cVar17 = -(uVar18 < -uVar26);
    }
    else {
      cVar17 = CARRY4(uVar26,uVar18);
    }
    uVar28 = uVar26 + uVar18 + uVar13;
    uVar29 = uVar28 + uVar13;
    uVar30 = uVar29 + uVar14;
    uVar19 = uVar30 + uVar14;
    uVar20 = uVar19 + uVar24;
    uVar21 = uVar20 - uVar16;
    cVar17 = ((CARRY4(uVar30,uVar14) +
               CARRY4(uVar28,uVar13) + cVar17 + CARRY4(uVar26 + uVar18,uVar13) +
               CARRY4(uVar29,uVar14) + CARRY4(uVar19,uVar24)) - (uVar20 < uVar16)) -
             (uVar21 < uVar27);
    uVar26 = (uint)cVar17;
    uVar18 = (uint)(pmVar5[2] >> 0x20);
    if (cVar17 < '\0') {
      cVar17 = -(uVar18 < -uVar26);
    }
    else {
      cVar17 = CARRY4(uVar26,uVar18);
    }
    uVar28 = uVar26 + uVar18 + uVar14;
    uVar29 = uVar28 + uVar14;
    uVar30 = uVar29 + uVar24;
    uVar19 = uVar30 + uVar24;
    uVar20 = uVar19 + uVar25;
    uVar22 = uVar20 - uVar27;
    cVar17 = ((CARRY4(uVar30,uVar24) +
               CARRY4(uVar28,uVar14) + cVar17 + CARRY4(uVar26 + uVar18,uVar14) +
               CARRY4(uVar29,uVar24) + CARRY4(uVar19,uVar25)) - (uVar20 < uVar27)) -
             (uVar22 < uVar11);
    pmVar5[2] = CONCAT44(uVar22 - uVar11,uVar21 - uVar27);
    uVar26 = (uint)cVar17;
    uVar18 = (uint)pmVar5[3];
    if (cVar17 < '\0') {
      cVar17 = -(uVar18 < -uVar26);
    }
    else {
      cVar17 = CARRY4(uVar26,uVar18);
    }
    uVar28 = uVar26 + uVar18 + uVar24;
    uVar29 = uVar28 + uVar24;
    uVar30 = uVar29 + uVar25;
    uVar19 = uVar30 + uVar25;
    uVar20 = uVar19 + uVar24;
    uVar21 = uVar20 + uVar14;
    uVar22 = uVar21 - uVar6;
    cVar17 = ((CARRY4(uVar19,uVar24) +
               CARRY4(uVar29,uVar25) +
               CARRY4(uVar26 + uVar18,uVar24) + cVar17 + CARRY4(uVar28,uVar24) +
               CARRY4(uVar30,uVar25) + CARRY4(uVar20,uVar14)) - (uVar21 < uVar6)) -
             (uVar22 < uVar16);
    uVar24 = (uint)cVar17;
    uVar18 = (uint)(pmVar5[3] >> 0x20);
    if (cVar17 < '\0') {
      cVar17 = -(uVar18 < -uVar24);
    }
    else {
      cVar17 = CARRY4(uVar24,uVar18);
    }
    uVar26 = uVar24 + uVar18 + uVar25;
    uVar28 = uVar26 + uVar25;
    uVar29 = uVar28 + uVar25;
    uVar30 = uVar29 + uVar6;
    uVar19 = uVar30 - uVar27;
    uVar20 = uVar19 - uVar11;
    uVar21 = uVar20 - uVar13;
    bVar15 = ((((CARRY4(uVar28,uVar25) +
                 CARRY4(uVar24 + uVar18,uVar25) + cVar17 + CARRY4(uVar26,uVar25) +
                CARRY4(uVar29,uVar6)) - (uVar30 < uVar27)) - (uVar19 < uVar11)) - (uVar20 < uVar13))
             - (uVar21 < uVar14);
    pmVar5[3] = CONCAT44(uVar21 - uVar14,uVar22 - uVar16);
    bVar10 = 0;
    if ('\0' < (char)bVar15) {
      bVar10 = bVar15;
    }
    pmVar5[4] = (ulong)bVar10 | uVar9 & 0xffffffff00000000;
    uVar4 = N->n;
    uVar9 = 8;
    while (uVar1 = uVar9 + 1, uVar1 < (uint)uVar4 * 2) {
      uVar12 = 0xffffffff00000000;
      if ((uVar9 & 1) == 0) {
        uVar12 = 0xffffffff;
      }
      puVar2 = (ulong *)((long)pmVar5 + (uVar1 & 0xfffffffffffffffe) * 4);
      *puVar2 = *puVar2 & uVar12;
      uVar9 = uVar1;
    }
    if ((char)bVar15 < '\0') {
      for (lVar8 = 0; lVar8 != 5; lVar8 = lVar8 + 1) {
        pmVar5[lVar8] = ~pmVar5[lVar8];
      }
      uVar9 = 0;
      do {
        pmVar3 = pmVar5 + uVar9;
        *pmVar3 = *pmVar3 + 1;
        if (3 < uVar9) break;
        uVar9 = uVar9 + 1;
      } while (*pmVar3 == 0);
      N->s = -1;
      pmVar5[4] = pmVar5[4] - (long)(char)bVar15;
    }
  }
  return iVar7;
}

Assistant:

static int ecp_mod_p256(mbedtls_mpi *N)
{
    INIT(256);

    ADD(8); ADD(9);
    SUB(11); SUB(12); SUB(13); SUB(14);             NEXT;         // A0

    ADD(9); ADD(10);
    SUB(12); SUB(13); SUB(14); SUB(15);             NEXT;         // A1

    ADD(10); ADD(11);
    SUB(13); SUB(14); SUB(15);                        NEXT;       // A2

    ADD(11); ADD(11); ADD(12); ADD(12); ADD(13);
    SUB(15); SUB(8); SUB(9);                        NEXT;         // A3

    ADD(12); ADD(12); ADD(13); ADD(13); ADD(14);
    SUB(9); SUB(10);                                   NEXT;      // A4

    ADD(13); ADD(13); ADD(14); ADD(14); ADD(15);
    SUB(10); SUB(11);                                   NEXT;     // A5

    ADD(14); ADD(14); ADD(15); ADD(15); ADD(14); ADD(13);
    SUB(8); SUB(9);                                   NEXT;       // A6

    ADD(15); ADD(15); ADD(15); ADD(8);
    SUB(10); SUB(11); SUB(12); SUB(13);             LAST;         // A7

cleanup:
    return ret;
}